

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_hdr.c
# Opt level: O0

MPP_RET write_jpeg_header(JpegeBits *bits,JpegeSyntax *syntax,RK_U8 **qtables)

{
  uint uVar1;
  uint local_24;
  RK_U32 qtable_number;
  RK_U32 i;
  RK_U8 **qtables_local;
  JpegeSyntax *syntax_local;
  JpegeBits *bits_local;
  
  uVar1 = 2;
  if (syntax->nb_components == 1) {
    uVar1 = 1;
  }
  if (syntax->comment_length != 0) {
    write_jpeg_comment_header(bits,syntax);
  }
  if (*qtables == (RK_U8 *)0x0) {
    if (syntax->qtable_y == (RK_U8 *)0x0) {
      *qtables = qtable_y[syntax->quality];
    }
    else {
      *qtables = syntax->qtable_y;
    }
  }
  if (qtables[1] == (RK_U8 *)0x0) {
    if (syntax->qtable_c == (RK_U8 *)0x0) {
      qtables[1] = qtable_c[syntax->quality];
    }
    else {
      qtables[1] = syntax->qtable_c;
    }
  }
  for (local_24 = 0; local_24 < uVar1; local_24 = local_24 + 1) {
    write_jpeg_dqt_header(bits,qtables[local_24],local_24);
  }
  write_jpeg_SOFO_header(bits,syntax);
  write_jpeg_RestartInterval(bits,syntax);
  write_jpeg_dht_header(bits,syntax);
  write_jpeg_sos_header(bits,syntax);
  jpege_bits_align_byte(bits);
  return MPP_OK;
}

Assistant:

MPP_RET write_jpeg_header(JpegeBits *bits, JpegeSyntax *syntax, const RK_U8 *qtables[2])
{
    RK_U32 i = 0;
    RK_U32 qtable_number = syntax->nb_components == 1 ? 1 : 2;

    /* Com header */
    if (syntax->comment_length)
        write_jpeg_comment_header(bits, syntax);

    /* Quant header */
    if (!qtables[0]) {
        if (syntax->qtable_y)
            qtables[0] = syntax->qtable_y;
        else
            qtables[0] = qtable_y[syntax->quality];
    }

    if (!qtables[1]) {
        if (syntax->qtable_c)
            qtables[1] = syntax->qtable_c;
        else
            qtables[1] = qtable_c[syntax->quality];
    }

    for (i = 0; i < qtable_number; i++)
        write_jpeg_dqt_header(bits, qtables[i], i);

    /* Frame header */
    write_jpeg_SOFO_header(bits, syntax);

    /* Do NOT have Restart interval */
    write_jpeg_RestartInterval(bits, syntax);

    /* Huffman header */
    write_jpeg_dht_header(bits, syntax);

    /* Scan header */
    write_jpeg_sos_header(bits, syntax);

    jpege_bits_align_byte(bits);
    return MPP_OK;
}